

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# P2PSocket.cpp
# Opt level: O1

void __thiscall P2PSocket::P2PSocket(P2PSocket *this,int maxPeers,bool debug)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  _Rb_tree_header *p_Var3;
  _Base_ptr **ppp_Var4;
  long *plVar5;
  undefined1 local_a0 [8];
  _Rb_tree_node_base local_98;
  size_t local_78;
  _Base_ptr *local_70;
  _Rb_tree_color local_68 [2];
  _Base_ptr local_60;
  _Base_ptr local_58;
  _Base_ptr local_50;
  size_t local_48;
  P2PSocket *local_40;
  int local_38;
  
  this->m_debug = debug;
  SocketResource::SocketResource(&this->m_socket,-1);
  p_Var1 = &(this->m_peers).m_peers._M_t._M_impl.super__Rb_tree_header;
  (this->m_peers).m_peers._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_peers).m_peers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_peers).m_peers._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_peers).m_peers._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->m_peers).m_peers._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &(this->m_peers).m_ip2PeerMap._M_t._M_impl.super__Rb_tree_header;
  (this->m_peers).m_ip2PeerMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_peers).m_ip2PeerMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_peers).m_ip2PeerMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  (this->m_peers).m_ip2PeerMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  (this->m_peers).m_ip2PeerMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var3 = &(this->m_events).super_EventRegister.m_events._M_t._M_impl.super__Rb_tree_header;
  (this->m_events).super_EventRegister.m_events._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_color = _S_red;
  *(_Base_ptr *)
   ((long)&(this->m_events).super_EventRegister.m_events._M_t._M_impl.super__Rb_tree_header.
           _M_header + 8) = (_Base_ptr)0x0;
  *(_Rb_tree_header **)
   ((long)&(this->m_events).super_EventRegister.m_events._M_t._M_impl.super__Rb_tree_header.
           _M_header + 0x10) = p_Var3;
  *(_Rb_tree_header **)
   ((long)&(this->m_events).super_EventRegister.m_events._M_t._M_impl.super__Rb_tree_header.
           _M_header + 0x18) = p_Var3;
  (this->m_events).super_EventRegister.m_events._M_t._M_impl.super__Rb_tree_header._M_node_count = 0
  ;
  this->m_maxPeers = maxPeers;
  if (0xffffff00 < maxPeers - 0x100U) {
    Peers::Peers((Peers *)local_a0,this);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Peer,_std::default_delete<Peer>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Peer,_std::default_delete<Peer>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Peer,_std::default_delete<Peer>_>_>_>_>
    ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Peer,_std::default_delete<Peer>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Peer,_std::default_delete<Peer>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Peer,_std::default_delete<Peer>_>_>_>_>
             *)&this->m_peers);
    if (local_98._M_parent != (_Base_ptr)0x0) {
      (this->m_peers).m_peers._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
           local_98._M_color;
      (this->m_peers).m_peers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           local_98._M_parent;
      (this->m_peers).m_peers._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           local_98._M_left;
      (this->m_peers).m_peers._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           local_98._M_right;
      (local_98._M_parent)->_M_parent = &p_Var1->_M_header;
      (this->m_peers).m_peers._M_t._M_impl.super__Rb_tree_header._M_node_count = local_78;
      local_98._M_parent = (_Base_ptr)0x0;
      local_78 = 0;
      local_98._M_left = &local_98;
      local_98._M_right = &local_98;
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
    ::clear(&(this->m_peers).m_ip2PeerMap._M_t);
    if (local_60 != (_Base_ptr)0x0) {
      (this->m_peers).m_ip2PeerMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
           local_68[0];
      (this->m_peers).m_ip2PeerMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = local_60
      ;
      (this->m_peers).m_ip2PeerMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = local_58;
      (this->m_peers).m_ip2PeerMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right = local_50;
      local_60->_M_parent = &p_Var2->_M_header;
      (this->m_peers).m_ip2PeerMap._M_t._M_impl.super__Rb_tree_header._M_node_count = local_48;
      local_60 = (_Base_ptr)0x0;
      local_48 = 0;
      local_58 = (_Base_ptr)local_68;
      local_50 = (_Base_ptr)local_68;
    }
    (this->m_peers).m_count = local_38;
    (this->m_peers).m_p2pSocket = local_40;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                 *)&local_70);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Peer,_std::default_delete<Peer>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Peer,_std::default_delete<Peer>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Peer,_std::default_delete<Peer>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Peer,_std::default_delete<Peer>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Peer,_std::default_delete<Peer>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Peer,_std::default_delete<Peer>_>_>_>_>
                 *)local_a0);
    return;
  }
  plVar5 = (long *)__cxa_allocate_exception(0x20);
  ppp_Var4 = (_Base_ptr **)((long)&local_98 + 8);
  local_a0 = (undefined1  [8])ppp_Var4;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a0,"Max peers argument must be a valid single byte unsigned integer",""
            );
  *plVar5 = (long)(plVar5 + 2);
  if (local_a0 == (undefined1  [8])ppp_Var4) {
    *(undefined4 *)(plVar5 + 2) = local_98._M_parent._0_4_;
    *(undefined4 *)((long)plVar5 + 0x14) = local_98._M_parent._4_4_;
    *(undefined4 *)(plVar5 + 3) = local_98._M_left._0_4_;
    *(undefined4 *)((long)plVar5 + 0x1c) = local_98._M_left._4_4_;
  }
  else {
    *plVar5 = (long)local_a0;
    plVar5[2] = (long)local_98._M_parent;
  }
  plVar5[1] = local_98._0_8_;
  local_98._M_color = _S_red;
  local_98._4_4_ = 0;
  local_98._M_parent = (_Base_ptr)((ulong)local_98._M_parent & 0xffffffffffffff00);
  local_a0 = (undefined1  [8])ppp_Var4;
  __cxa_throw(plVar5,&P2PSocketException::typeinfo,P2PSocketException::~P2PSocketException);
}

Assistant:

P2PSocket::P2PSocket(int maxPeers, bool debug) : m_debug(debug), m_maxPeers(maxPeers)
{
    if (maxPeers < 0x01 || maxPeers > 0xFF) {
        throw P2PSocketException("Max peers argument must be a valid single byte unsigned integer");
    }

    m_peers = Peers(this);
}